

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_memcpy.h
# Opt level: O1

crc32c_t absl::lts_20250127::crc_internal::CrcMemcpy::CrcAndCopy
                   (void *dst,void *src,size_t length,crc32c_t initial_crc,bool non_temporal)

{
  uint32_t uVar1;
  int iVar2;
  ArchSpecificEngines *pAVar3;
  
  if (CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)::engines == '\0'
     ) {
    iVar2 = __cxa_guard_acquire(&CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)
                                 ::engines);
    if (iVar2 != 0) {
      CrcAndCopy::engines = GetArchSpecificEngines();
      __cxa_guard_release(&CrcAndCopy(void*,void_const*,unsigned_long,absl::lts_20250127::crc32c_t,bool)
                           ::engines);
    }
  }
  pAVar3 = &CrcAndCopy::engines;
  if (non_temporal) {
    pAVar3 = (ArchSpecificEngines *)&CrcAndCopy::engines.non_temporal;
  }
  uVar1 = (*pAVar3->temporal->_vptr_CrcMemcpyEngine[2])
                    (pAVar3->temporal,dst,src,length,(ulong)initial_crc.crc_);
  return (crc32c_t)uVar1;
}

Assistant:

static crc32c_t CrcAndCopy(void* __restrict dst, const void* __restrict src,
                             std::size_t length,
                             crc32c_t initial_crc = crc32c_t{0},
                             bool non_temporal = false) {
    static const ArchSpecificEngines engines = GetArchSpecificEngines();
    auto* engine = non_temporal ? engines.non_temporal : engines.temporal;
    return engine->Compute(dst, src, length, initial_crc);
  }